

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void std::pmr::formatInvalidMemoryBlock
               (AlignedHeader *address,size_t deallocatedBytes,size_t deallocatedAlignment,
               test_resource *allocator,int underrunBy,int overrunBy)

{
  AlignedHeader *address_00;
  unsigned_long *puVar1;
  unsigned_long local_58;
  AlignedHeader *local_50;
  byte *payload;
  size_t alignment;
  size_t numBytes;
  uint local_30;
  uint magicNumber;
  int overrunBy_local;
  int underrunBy_local;
  test_resource *allocator_local;
  size_t deallocatedAlignment_local;
  size_t deallocatedBytes_local;
  AlignedHeader *address_local;
  
  numBytes._4_4_ = (address->m_object_).m_magic_number_;
  alignment = (address->m_object_).m_bytes_;
  payload = *(byte **)&(address->m_alignment_).__clang_max_align_nonce2;
  local_50 = address + 1;
  local_30 = overrunBy;
  magicNumber = underrunBy;
  _overrunBy_local = allocator;
  allocator_local = (test_resource *)deallocatedAlignment;
  deallocatedAlignment_local = deallocatedBytes;
  deallocatedBytes_local = (size_t)address;
  if (numBytes._4_4_ == 0xdeadbeef) {
    if (alignment == 0) {
      printf("*** Invalid (non-positive) byte count %zu at address %p. *** \n",0,local_50);
    }
    if (deallocatedAlignment_local != *(size_t *)(deallocatedBytes_local + 8)) {
      printf("*** Freeing segment at %p using wrong size (%zu vs. %zu). ***\n",local_50,
             deallocatedAlignment_local,alignment);
    }
    if (allocator_local != *(test_resource **)(deallocatedBytes_local + 0x10)) {
      printf("*** Freeing segment at %p using wrong alignment (%zu vs. %zu). ***\n",local_50,
             allocator_local,payload);
    }
    if (_overrunBy_local != *(test_resource **)(deallocatedBytes_local + 0x28)) {
      printf("*** Freeing segment at %p from wrong allocator. ***\n",local_50);
    }
    if (magicNumber != 0) {
      printf("*** Memory corrupted at %d bytes before %zu byte segment at %p. ***\n",
             (ulong)magicNumber,alignment,local_50);
      printf("Pad area before user segment:\n");
      formatBlock((void *)((long)local_50 + -0x10),0x10);
    }
    if (local_30 != 0) {
      printf("*** Memory corrupted at %d bytes after %zu byte segment at %p. ***\n",(ulong)local_30,
             alignment,local_50);
      printf("Pad area after user segment:\n");
      formatBlock((void *)((long)local_50 + alignment),0x10);
    }
  }
  else if (numBytes._4_4_ == 0xdeadf00d) {
    printf("*** Deallocating previously deallocated memory at %p. ***\n",local_50);
  }
  else {
    printf("*** Invalid magic number 0x%08x at address %p. ***\n",(ulong)numBytes._4_4_,local_50);
  }
  printf("Header:\n");
  formatBlock((void *)deallocatedBytes_local,0x40);
  printf("User segment:\n");
  address_00 = local_50;
  local_58 = 0x40;
  puVar1 = min<unsigned_long>(&local_58,&alignment);
  formatBlock(address_00,*puVar1);
  return;
}

Assistant:

static
void formatInvalidMemoryBlock(AlignedHeader *address,
                              size_t         deallocatedBytes,
                              size_t         deallocatedAlignment,
                              test_resource *allocator,
                              int            underrunBy,
                              int            overrunBy)
    // Format the contents of the presumably invalid memory block at the
    // specified 'address' to 'stdout', using the specified 'allocator',
    // 'underrunBy', and 'overrunBy' information.  A suitable error message,
    // if appropriate, is printed first, followed by a block of memory
    // indicating the header and any extra padding appropriate for the current
    // platform.  Finally, the first 64 bytes of memory of the "payload"
    // portion of the allocated memory is printed (regardless of the amount of
    // memory that was requested).
{
    unsigned int  magicNumber = address->m_object_.m_magic_number_;
    size_t        numBytes    = address->m_object_.m_bytes_;
    size_t        alignment   = address->m_object_.m_alignment_;
    byte         *payload     = reinterpret_cast<byte *>(address + 1);

    if (allocatedMemoryPattern != magicNumber) {
        if (deallocatedMemoryPattern == magicNumber) {
            printf("*** Deallocating previously deallocated memory at %p."
                   " ***\n",
                   static_cast<void *>(payload));
        }
        else {
            printf("*** Invalid magic number 0x%08x at address %p. ***\n",
                   magicNumber,
                   static_cast<void *>(payload));
        }
    }
    else {
        if (numBytes <= 0) {
            printf("*** Invalid (non-positive) byte count %zu at address %p. "
                   "*** \n",
                   numBytes,
                   static_cast<void *>(payload));
        }
        if (deallocatedBytes != address->m_object_.m_bytes_) {
            printf("*** Freeing segment at %p using wrong size (%zu vs. %zu). "
                   "***\n",
                   static_cast<void *>(payload),
                   deallocatedBytes,
                   numBytes);
        }
        if (deallocatedAlignment != address->m_object_.m_alignment_) {
            printf("*** Freeing segment at %p using wrong alignment (%zu vs. "
                   "%zu). ***\n",
                   static_cast<void *>(payload),
                   deallocatedAlignment,
                   alignment);
        }
        if (allocator != address->m_object_.m_pmr_) {
            printf("*** Freeing segment at %p from wrong allocator. ***\n",
                   static_cast<void *>(payload));
        }
        if (underrunBy) {
            printf("*** Memory corrupted at %d bytes before %zu byte segment "
                   "at %p. ***\n",
                   underrunBy,
                   numBytes,
                   static_cast<void *>(payload));

            printf("Pad area before user segment:\n");
            formatBlock(payload - paddingSize, paddingSize);
        }
        if (overrunBy) {
            printf("*** Memory corrupted at %d bytes after %zu byte segment "
                   "at %p. ***\n",
                   overrunBy,
                   numBytes,
                   static_cast<void *>(payload));

            printf("Pad area after user segment:\n");
            formatBlock(payload + numBytes, paddingSize);
        }
    }

    printf("Header:\n");
    formatBlock(address, sizeof *address);
    printf("User segment:\n");
    formatBlock(payload, min<std::size_t>(64, numBytes));
}